

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  int __c;
  AlphaNum *in_RSI;
  char *__s;
  long in_RDI;
  int bytecode_estimate;
  int in_stack_ffffffffffffff4c;
  AlphaNum *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [5];
  char *in_stack_ffffffffffffffb8;
  Printer *in_stack_ffffffffffffffc0;
  string local_38 [36];
  int local_14;
  AlphaNum *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  pDVar1 = FieldDescriptor::extension_scope(*(FieldDescriptor **)(in_RDI + 8));
  if (pDVar1 == (Descriptor *)0x0) {
    __s = *(char **)(in_RDI + 8);
    UnderscoresToCamelCaseCheckReserved_abi_cxx11_((FieldDescriptor *)in_stack_ffffffffffffffa8);
    FieldDescriptor::index(*(FieldDescriptor **)(in_RDI + 8),__s,__c);
    strings::AlphaNum::AlphaNum(local_10,in_stack_ffffffffffffff4c);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff88);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_38);
    local_14 = local_14 + 0x15;
  }
  return local_14;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}